

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O3

void idx2::Copy<float>(grid *SGrid,volume *SVol,volume *DVol)

{
  long lVar1;
  grid_iterator<float> SEnd;
  grid_iterator<float> local_d0;
  grid_iterator<float> local_98;
  grid_iterator<float> local_60;
  
  Begin<float>(&local_98,SGrid,SVol);
  End<float>(&local_60,SGrid,SVol);
  Begin<float>(&local_d0,SGrid,DVol);
  while (local_98.Ptr != local_60.Ptr) {
    *local_d0.Ptr = *local_98.Ptr;
    local_98.P.field_0.field_0.X = local_98.P.field_0.field_0.X + local_98.S.field_0.field_0.X;
    local_98.Ptr = local_98.Ptr + local_98.S.field_0.field_0.X;
    if (local_98.D.field_0.field_0.X <= local_98.P.field_0.field_0.X) {
      local_98.P.field_0.field_0.X = 0;
      local_98.P.field_0.field_0.Y = local_98.P.field_0.field_0.Y + local_98.S.field_0.field_0.Y;
      lVar1 = (long)local_98.N.field_0.field_0.X;
      local_98.Ptr = local_98.Ptr +
                     (local_98.S.field_0.field_0.Y * lVar1 - (long)local_98.D.field_0.field_0.X);
      if (local_98.D.field_0.field_0.Y <= local_98.P.field_0.field_0.Y) {
        local_98.P.field_0.field_0.Y = 0;
        local_98.Ptr = local_98.Ptr +
                       ((long)local_98.N.field_0.field_0.Y * local_98.S.field_0.field_0.Z * lVar1 -
                       local_98.D.field_0.field_0.Y * lVar1);
      }
    }
    local_d0.P.field_0.field_0.X = local_d0.P.field_0.field_0.X + local_d0.S.field_0.field_0.X;
    local_d0.Ptr = local_d0.Ptr + local_d0.S.field_0.field_0.X;
    if (local_d0.D.field_0.field_0.X <= local_d0.P.field_0.field_0.X) {
      local_d0.P.field_0.field_0.X = 0;
      local_d0.P.field_0.field_0.Y = local_d0.P.field_0.field_0.Y + local_d0.S.field_0.field_0.Y;
      lVar1 = (long)local_d0.N.field_0.field_0.X;
      local_d0.Ptr = local_d0.Ptr +
                     (local_d0.S.field_0.field_0.Y * lVar1 - (long)local_d0.D.field_0.field_0.X);
      if (local_d0.D.field_0.field_0.Y <= local_d0.P.field_0.field_0.Y) {
        local_d0.P.field_0.field_0.Y = 0;
        local_d0.Ptr = local_d0.Ptr +
                       ((long)local_d0.N.field_0.field_0.Y * local_d0.S.field_0.field_0.Z * lVar1 -
                       local_d0.D.field_0.field_0.Y * lVar1);
      }
    }
  }
  return;
}

Assistant:

void
Copy(const grid& SGrid, const volume& SVol, volume* DVol)
{
  idx2_Assert(Dims(SGrid) <= Dims(*DVol));
  idx2_Assert(Dims(SGrid) <= Dims(SVol));
  idx2_Assert(DVol->Buffer && SVol.Buffer);
  idx2_Assert(SVol.Type == DVol->Type);

  auto SIt = Begin<t>(SGrid, SVol), SEnd = End<t>(SGrid, SVol);
  auto DIt = Begin<t>(SGrid, *DVol);
  for (; SIt != SEnd; ++SIt, ++DIt)
    *DIt = *SIt;
}